

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O0

Region * __thiscall GOESNImageHandler::loadRegion(GOESNImageHandler *this,NOAALRITHeader *h)

{
  ulong uVar1;
  int iVar2;
  pointer pvVar3;
  size_type sVar4;
  long in_RDX;
  Region *in_RDI;
  int num;
  size_t len;
  array<char,_32UL> buf;
  Region *region;
  Region *in_stack_fffffffffffffef0;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [36];
  uint local_5c;
  ulong local_58;
  array<char,_32UL> local_4c;
  undefined1 local_19;
  long local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  Region::Region(in_stack_fffffffffffffef0);
  if ((uint)*(ushort *)(local_18 + 10) % 10 == 1) {
    std::__cxx11::string::operator=((string *)in_RDI,"FD");
    std::__cxx11::string::operator=((string *)&in_RDI->nameLong,"Full Disk");
  }
  else if ((uint)*(ushort *)(local_18 + 10) % 10 == 2) {
    std::__cxx11::string::operator=((string *)in_RDI,"NH");
    std::__cxx11::string::operator=((string *)&in_RDI->nameLong,"Northern Hemisphere");
  }
  else if ((uint)*(ushort *)(local_18 + 10) % 10 == 3) {
    std::__cxx11::string::operator=((string *)in_RDI,"SH");
    std::__cxx11::string::operator=((string *)&in_RDI->nameLong,"Southern Hemisphere");
  }
  else if ((uint)*(ushort *)(local_18 + 10) % 10 == 4) {
    std::__cxx11::string::operator=((string *)in_RDI,"US");
    std::__cxx11::string::operator=((string *)&in_RDI->nameLong,"United States");
  }
  else {
    local_5c = (uint)*(ushort *)(local_18 + 10) % 10 - 5;
    pvVar3 = std::array<char,_32UL>::data((array<char,_32UL> *)0x295c14);
    sVar4 = std::array<char,_32UL>::size(&local_4c);
    iVar2 = snprintf(pvVar3,sVar4,"SI%02d",(ulong)local_5c);
    local_58 = (ulong)iVar2;
    pvVar3 = std::array<char,_32UL>::data((array<char,_32UL> *)0x295c54);
    uVar1 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pvVar3,uVar1,&local_81);
    std::__cxx11::string::operator=((string *)in_RDI,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    pvVar3 = std::array<char,_32UL>::data((array<char,_32UL> *)0x295cd4);
    sVar4 = std::array<char,_32UL>::size(&local_4c);
    iVar2 = snprintf(pvVar3,sVar4,"Special Interest %d",(ulong)local_5c);
    local_58 = (ulong)iVar2;
    pvVar3 = std::array<char,_32UL>::data((array<char,_32UL> *)0x295d14);
    uVar1 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pvVar3,uVar1,&local_a9);
    std::__cxx11::string::operator=((string *)&in_RDI->nameLong,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  return in_RDI;
}

Assistant:

Region GOESNImageHandler::loadRegion(const lrit::NOAALRITHeader& h) const {
  Region region;
  if (h.productSubID % 10 == 1) {
    region.nameShort = "FD";
    region.nameLong = "Full Disk";
  } else if (h.productSubID % 10 == 2) {
    region.nameShort = "NH";
    region.nameLong = "Northern Hemisphere";
  } else if (h.productSubID % 10 == 3) {
    region.nameShort = "SH";
    region.nameLong = "Southern Hemisphere";
  } else if (h.productSubID % 10 == 4) {
    region.nameShort = "US";
    region.nameLong = "United States";
  } else {
    std::array<char, 32> buf;
    size_t len;
    auto num = (h.productSubID % 10) - 5;
    len = snprintf(buf.data(), buf.size(), "SI%02d", num);
    region.nameShort = std::string(buf.data(), len);
    len = snprintf(buf.data(), buf.size(), "Special Interest %d", num);
    region.nameLong = std::string(buf.data(), len);
  }
  return region;
}